

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

void __thiscall
myEmployeeCustomConstructor::ArchiveOUT(myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);
        // stream out member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive << CHNVP(legs);
    }